

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void jsonGroupInverse(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  byte bVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  void *pvVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  
  bVar3 = false;
  pvVar5 = sqlite3_aggregate_context(ctx,0);
  if (pvVar5 != (void *)0x0) {
    lVar2 = *(long *)((long)pvVar5 + 8);
    uVar8 = 1;
    iVar9 = 0;
    while( true ) {
      iVar7 = (int)uVar8;
      lVar6 = *(ulong *)((long)pvVar5 + 0x18) - uVar8;
      if (*(ulong *)((long)pvVar5 + 0x18) < uVar8 || lVar6 == 0) break;
      bVar1 = *(byte *)(lVar2 + uVar8);
      if (((bVar1 == 0x2c) && (!bVar3)) && (iVar9 == 0)) {
        *(long *)((long)pvVar5 + 0x18) = lVar6;
        memmove((void *)(lVar2 + 1),(void *)((ulong)(iVar7 + 1) + lVar2),lVar6 - 1);
        *(undefined1 *)(lVar2 + *(long *)((long)pvVar5 + 0x18)) = 0;
        return;
      }
      if (bVar1 == 0x5c) {
        iVar7 = iVar7 + 1;
      }
      else if (bVar1 == 0x22) {
        bVar3 = !bVar3;
      }
      else {
        bVar4 = !bVar3;
        bVar3 = true;
        if (bVar4) {
          iVar9 = (iVar9 + (uint)((bVar1 & 0xdf) == 0x5b)) - (uint)((bVar1 & 0xdf) == 0x5d);
          bVar3 = false;
        }
      }
      uVar8 = (ulong)(iVar7 + 1);
    }
    *(undefined8 *)((long)pvVar5 + 0x18) = 1;
  }
  return;
}

Assistant:

static void jsonGroupInverse(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  unsigned int i;
  int inStr = 0;
  int nNest = 0;
  char *z;
  char c;
  JsonString *pStr;
  UNUSED_PARAMETER(argc);
  UNUSED_PARAMETER(argv);
  pStr = (JsonString*)sqlite3_aggregate_context(ctx, 0);
#ifdef NEVER
  /* pStr is always non-NULL since jsonArrayStep() or jsonObjectStep() will
  ** always have been called to initialize it */
  if( NEVER(!pStr) ) return;
#endif
  z = pStr->zBuf;
  for(i=1; i<pStr->nUsed && ((c = z[i])!=',' || inStr || nNest); i++){
    if( c=='"' ){
      inStr = !inStr;
    }else if( c=='\\' ){
      i++;
    }else if( !inStr ){
      if( c=='{' || c=='[' ) nNest++;
      if( c=='}' || c==']' ) nNest--;
    }
  }
  if( i<pStr->nUsed ){
    pStr->nUsed -= i;
    memmove(&z[1], &z[i+1], (size_t)pStr->nUsed-1);
    z[pStr->nUsed] = 0;
  }else{
    pStr->nUsed = 1;
  }
}